

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testStringProperty_Test::MaterialSystemTest_testStringProperty_Test
          (MaterialSystemTest_testStringProperty_Test *this)

{
  MaterialSystemTest_testStringProperty_Test *this_local;
  
  MaterialSystemTest::MaterialSystemTest(&this->super_MaterialSystemTest);
  (this->super_MaterialSystemTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MaterialSystemTest_testStringProperty_Test_0103df28;
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}